

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O3

int calc_feat_idx(acmod_t *acmod,int frame_idx)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = acmod->n_feat_alloc;
  uVar3 = uVar1 - acmod->n_feat_frame;
  uVar4 = acmod->output_frame - frame_idx;
  if ((frame_idx < 0) || ((int)uVar3 < (int)uVar4)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
            ,0x415,"Frame %d outside queue of %d frames, %d alloc (%d > %d), cannot score\n",
            frame_idx,(ulong)(uint)acmod->n_feat_frame,(ulong)uVar1,(ulong)uVar4,(ulong)uVar3);
    iVar2 = -1;
  }
  else {
    iVar2 = ((frame_idx - acmod->output_frame) + acmod->feat_outidx) % (int)uVar1;
    iVar2 = (iVar2 >> 0x1f & uVar1) + iVar2;
  }
  return iVar2;
}

Assistant:

static int
calc_feat_idx(acmod_t *acmod, int frame_idx)
{
    int n_backfr, feat_idx;

    n_backfr = acmod->n_feat_alloc - acmod->n_feat_frame;
    if (frame_idx < 0 || acmod->output_frame - frame_idx > n_backfr) {
        E_ERROR("Frame %d outside queue of %d frames, %d alloc (%d > %d), "
                "cannot score\n", frame_idx, acmod->n_feat_frame,
                acmod->n_feat_alloc, acmod->output_frame - frame_idx,
                n_backfr);
        return -1;
    }

    /* Get the index in feat_buf/framepos of the frame to be scored. */
    feat_idx = (acmod->feat_outidx + frame_idx - acmod->output_frame) %
               acmod->n_feat_alloc;
    if (feat_idx < 0)
        feat_idx += acmod->n_feat_alloc;

    return feat_idx;
}